

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sws.c
# Opt level: O3

int get_request(curl_socket_t sock,httprequest *req)

{
  byte bVar1;
  unsigned_short uVar2;
  int iVar3;
  uint uVar4;
  long lVar5;
  char *pcVar6;
  uint *puVar7;
  size_t sVar8;
  size_t sVar9;
  ulong uVar10;
  long *plVar11;
  int *piVar12;
  char *pcVar13;
  char *pcVar14;
  ulong uVar15;
  byte *pbVar16;
  byte *pbVar17;
  uint uVar18;
  size_t __n;
  size_t sVar19;
  int prot_minor;
  int prot_major;
  char *endp;
  char logbuf [456];
  uint local_218;
  uint local_214;
  char *local_210;
  char *local_208;
  byte *local_200;
  char local_1f8 [456];
  
  if (req->pipelining == false) {
    uVar10 = req->offset;
    if (uVar10 < 149999) {
LAB_00106274:
      if (req->skip == 0) {
        sVar8 = 149999 - uVar10;
      }
      else {
        sVar8 = req->cl;
      }
      lVar5 = recv(sock,req->reqbuf + uVar10,sVar8,0);
      goto LAB_00106299;
    }
LAB_00107006:
    pcVar14 = "Request would overflow buffer, closing connection";
LAB_0010700d:
    logmsg(pcVar14);
    req->reqbuf[149999] = '\0';
    uVar18 = 0xffffffff;
LAB_00107020:
    uVar4 = uVar18;
    storerequest(req->reqbuf,(&req->checkindex)[req->pipelining ^ 1]);
LAB_0010703a:
    uVar4 = -(uint)(got_exit_signal != 0) | uVar4;
  }
  else {
    sVar19 = req->checkindex;
    req->pipelining = false;
    __n = req->offset - sVar19;
    req->checkindex = 0;
    req->offset = 0;
    if (req == (httprequest *)0x0 || __n == 0) {
      uVar10 = 0;
      goto LAB_00106274;
    }
    memmove(req,req->reqbuf + sVar19,__n);
    lVar5 = curlx_uztosz(__n);
LAB_00106299:
    if (got_exit_signal != 0) {
      return -1;
    }
    if (lVar5 == 0) {
      logmsg("Connection closed by client");
    }
    else {
      if (-1 < lVar5) {
        logmsg("Read %zd bytes",lVar5);
        sVar19 = lVar5 + req->offset;
        req->offset = sVar19;
        req->reqbuf[sVar19] = '\0';
        pcVar14 = req->reqbuf + req->checkindex;
        pcVar6 = strstr(pcVar14,end_of_headers);
        iVar3 = req->callcount;
        req->callcount = iVar3 + 1;
        pcVar13 = "";
        if (0 < iVar3) {
          pcVar13 = " [CONTINUED]";
        }
        logmsg("Process %d bytes request%s",req->offset,pcVar13);
        if (use_gopher == '\x01') {
          if (req->testno != -4) goto LAB_001064c1;
          iVar3 = strncmp("/verifiedserver",pcVar14,0xf);
          if (iVar3 != 0) goto LAB_001063f7;
          logmsg("Are-we-friendly question received");
          req->testno = -2;
LAB_00106fb3:
          uVar18 = 1;
        }
        else {
          if (req->testno == -4) {
LAB_001063f7:
            iVar3 = __isoc99_sscanf(pcVar14,"%255s %139999s HTTP/%d.%d",ProcessRequest_request,
                                    &ProcessRequest_doc,&local_214,&local_218);
            uVar18 = local_218;
            if (iVar3 != 4) goto LAB_001064c1;
            uVar10 = (ulong)local_214;
            req->prot_version = local_218 + local_214 * 10;
            local_208 = pcVar6;
            pcVar6 = strrchr(&ProcessRequest_doc,0x2f);
            local_210 = pcVar6;
            if (pcVar6 != (char *)0x0) {
              sVar8 = strlen(&ProcessRequest_doc);
              sVar9 = strlen(ProcessRequest_request);
              if (sVar9 + sVar8 < 400) {
                curl_msnprintf(local_1f8,0x1c8,"Got request: %s %s HTTP/%d.%d",
                               ProcessRequest_request,&ProcessRequest_doc,uVar10,uVar18);
              }
              else {
                curl_msnprintf(local_1f8,0x1c8,"Got a *HUGE* request HTTP/%d.%d",uVar10);
              }
              logmsg("%s",local_1f8);
              iVar3 = strncmp("/verifiedserver",pcVar6,0xf);
              if (iVar3 == 0) {
                lVar5 = -2;
                pcVar14 = "Are-we-friendly question received";
              }
              else {
                iVar3 = strncmp("/quit",pcVar6,5);
                if (iVar3 != 0) {
                  do {
                    pcVar6 = pcVar6 + 1;
                    if (*pcVar6 == 0) break;
                    iVar3 = Curl_isdigit((uint)(byte)*pcVar6);
                  } while (iVar3 == 0);
                  local_210 = pcVar6;
                  uVar10 = strtol(pcVar6,&local_210,10);
                  req->testno = uVar10;
                  if (10000 < (long)uVar10) {
                    req->partno = uVar10 % 10000;
                    req->testno = uVar10 / 10000;
                    uVar10 = uVar10 / 10000;
LAB_00106628:
                    curl_msnprintf(local_1f8,0x1c8,"Requested test number %ld part %ld",uVar10);
                    logmsg("%s",local_1f8);
                    parse_servercmd(req);
                    goto LAB_0010665c;
                  }
                  req->partno = 0;
                  if (uVar10 != 0) goto LAB_00106628;
                  req->testno = -4;
                  goto LAB_00106674;
                }
                lVar5 = -3;
                pcVar14 = "Request-to-quit received";
              }
              logmsg(pcVar14);
              req->testno = lVar5;
              goto LAB_00106fb3;
            }
LAB_0010665c:
            pcVar6 = local_208;
            if (req->testno == -4) {
LAB_00106674:
              pcVar6 = local_208;
              iVar3 = __isoc99_sscanf(req,"CONNECT %139999s HTTP/%d.%d",&ProcessRequest_doc,
                                      &local_214);
              if (iVar3 == 3) {
                curl_msnprintf(local_1f8,0x1c8,"Received a CONNECT %s HTTP/%d.%d request",
                               &ProcessRequest_doc,(ulong)local_214,(ulong)local_218);
                logmsg("%s");
                req->connect_request = true;
                if (req->prot_version == 10) {
                  req->open = false;
                }
                if (ProcessRequest_doc == '[') {
                  pcVar6 = "Invalid CONNECT IPv6 address format";
                  if (DAT_0010e781 == 0) {
                    uVar10 = 0;
                  }
                  else {
                    uVar10 = 0;
                    pbVar17 = &DAT_0010e781;
                    bVar1 = DAT_0010e781;
                    do {
                      iVar3 = Curl_isxdigit((uint)bVar1);
                      if (((iVar3 == 0) && (bVar1 = *pbVar17, bVar1 != 0x2e)) && (bVar1 != 0x3a)) {
                        if (bVar1 == 0x5d) {
                          if (pbVar17[1] == 0x3a) {
                            pbVar17 = pbVar17 + 1;
                            goto LAB_001067b4;
                          }
                          pcVar6 = "Invalid CONNECT IPv6 port format";
                        }
                        break;
                      }
                      uVar10 = strtoul((char *)pbVar17,(char **)&local_200,0x10);
                      iVar3 = Curl_isxdigit((uint)*pbVar17);
                      pbVar16 = local_200;
                      if (iVar3 == 0) {
                        pbVar16 = pbVar17 + 1;
                      }
                      bVar1 = *pbVar16;
                      pbVar17 = pbVar16;
                    } while (bVar1 != 0);
                  }
                  pbVar17 = (byte *)0x0;
                  logmsg(pcVar6);
LAB_001067b4:
                  req->testno = uVar10;
                }
                else {
                  pbVar17 = (byte *)strchr(&ProcessRequest_doc,0x3a);
                }
                if (((pbVar17 != (byte *)0x0) && (pbVar17[1] != 0)) &&
                   (iVar3 = Curl_isdigit((uint)pbVar17[1]), iVar3 != 0)) {
                  uVar10 = strtoul((char *)(pbVar17 + 1),(char **)0x0,10);
                  if (uVar10 - 0x10000 < 0xffffffffffff0001) {
                    logmsg("Invalid CONNECT port received");
                  }
                  else {
                    uVar2 = curlx_ultous(uVar10);
                    req->connect_port = uVar2;
                  }
                }
                logmsg("Port number: %d, test case number: %ld",(ulong)req->connect_port,req->testno
                      );
                pcVar6 = local_208;
              }
              if (req->testno == -4) {
                pcVar13 = strstr(pcVar14,"\nTestno: ");
                if (pcVar13 != (char *)0x0) {
                  lVar5 = strtol(pcVar13 + 9,(char **)0x0,10);
                  req->testno = lVar5;
                  logmsg("Found test number %d in Testno: header!",lVar5);
                  if (req->testno != -4) goto LAB_00106988;
                }
                pcVar13 = strrchr(&ProcessRequest_doc,0x2e);
                if (pcVar13 != (char *)0x0) {
                  local_210 = pcVar13 + 1;
                  uVar10 = strtol(local_210,&local_210,10);
                  req->testno = uVar10;
                  if ((long)uVar10 < 0x2711) {
                    req->partno = 0;
                  }
                  else {
                    req->partno = uVar10 % 10000;
                    req->testno = uVar10 / 10000;
                    logmsg("found test %d in requested host name",uVar10 / 10000);
                    uVar10 = req->testno;
                  }
                  curl_msnprintf(local_1f8,0x1c8,
                                 "Requested test number %ld part %ld (from host name)",uVar10);
                  logmsg("%s",local_1f8);
                  if (req->testno == 0) {
                    logmsg("Did not find test number in PATH");
                    req->testno = -1;
                    goto LAB_00106988;
                  }
                }
                parse_servercmd(req);
              }
            }
          }
          else {
LAB_001064c1:
            if ((2 < req->offset) && (req->testno == -4)) {
              logmsg("** Unusual request. Starts with %02x %02x %02x",(ulong)(uint)(int)*pcVar14,
                     (ulong)(uint)(int)pcVar14[1],(ulong)(uint)(int)pcVar14[2]);
            }
          }
LAB_00106988:
          if (pcVar6 != (char *)0x0) {
            logmsg("- request found to be complete");
            if ((use_gopher == '\x01') && (pcVar13 = strrchr(pcVar14,0x2f), pcVar13 != (char *)0x0))
            {
              do {
                pcVar13 = pcVar13 + 1;
                if (*pcVar13 == 0) break;
                iVar3 = Curl_isdigit((uint)(byte)*pcVar13);
              } while (iVar3 == 0);
              local_210 = pcVar13;
              uVar10 = strtol(pcVar13,&local_210,10);
              if ((long)uVar10 < 0x2711) {
                uVar15 = 0;
              }
              else {
                uVar15 = uVar10 % 10000;
                uVar10 = uVar10 / 10000;
              }
              req->testno = uVar10;
              req->partno = uVar15;
              curl_msnprintf(local_1f8,0x1c8,"Requested GOPHER test number %ld part %ld");
              logmsg("%s",local_1f8);
            }
            if (req->pipe != 0) {
              sVar8 = strlen(end_of_headers);
              req->checkindex = (size_t)(pcVar6 + req->checkindex + (sVar8 - (long)pcVar14));
            }
LAB_00106ab4:
            if (got_exit_signal != 0) goto LAB_00106fb3;
            if ((req->cl != 0) ||
               (iVar3 = Curl_strncasecompare("Content-Length:",pcVar14,0xf), iVar3 == 0)) {
              iVar3 = Curl_strncasecompare("Transfer-Encoding: chunked",pcVar14,0x1a);
              if (iVar3 == 0) goto code_r0x00106afb;
              pcVar14 = strstr(req->reqbuf,"\r\n0\r\n\r\n");
              if (pcVar14 != (char *)0x0) goto LAB_00106fb3;
              pcVar14 = strstr(req->reqbuf,"\r\n0\r\n");
              uVar18 = 1;
              if (pcVar14 == (char *)0x0) {
                if ((already_recv_zeroed_chunk != '\x01') ||
                   (pcVar14 = strstr(req->reqbuf,"\r\n\r\n"), pcVar14 == (char *)0x0))
                goto LAB_00106d82;
              }
              else {
                pcVar6 = strstr(req->reqbuf,"\r\n\r\n");
                do {
                  pcVar13 = pcVar6;
                  pcVar6 = strstr(pcVar13 + 4,"\r\n\r\n");
                } while (pcVar6 != (char *)0x0);
                if (pcVar13 <= pcVar14) {
                  already_recv_zeroed_chunk = '\x01';
LAB_00106d82:
                  uVar18 = 0;
                }
              }
              goto LAB_00106fb9;
            }
            bVar1 = pcVar14[0xf];
            pcVar14 = pcVar14 + 0xf;
            while ((bVar1 != 0 && (iVar3 = Curl_isspace((uint)bVar1), iVar3 != 0))) {
              bVar1 = pcVar14[1];
              pcVar14 = pcVar14 + 1;
            }
            local_210 = pcVar14;
            piVar12 = __errno_location();
            *piVar12 = 0;
            uVar10 = strtoul(pcVar14,&local_210,10);
            if (((pcVar14 == local_210) ||
                (iVar3 = Curl_isspace((uint)(byte)*local_210), iVar3 == 0)) || (*piVar12 == 0x22)) {
              logmsg("Found invalid Content-Length: (%s) in the request",pcVar14);
              req->open = false;
              goto LAB_00106fb3;
            }
            req->cl = uVar10 - (long)req->skip;
            logmsg("Found Content-Length: %lu in the request");
            if (req->skip != 0) {
              logmsg("... but will abort after %zu bytes",req->cl);
            }
LAB_00106b11:
            if (((req->auth == false) &&
                (pcVar14 = strstr(req->reqbuf,"Authorization:"), pcVar14 != (char *)0x0)) &&
               (req->auth = true, req->auth_req == true)) {
              logmsg("Authorization header found, as required");
            }
            pcVar14 = strstr(req->reqbuf,"Authorization: Negotiate");
            if (pcVar14 == (char *)0x0) {
              if ((req->digest == false) &&
                 (pcVar14 = strstr(req->reqbuf,"Authorization: Digest"), pcVar14 != (char *)0x0)) {
                sVar19 = req->partno + 1000;
                req->partno = sVar19;
                req->digest = true;
                pcVar14 = "Received Digest request, sending back data %ld";
              }
              else if (req->ntlm == false) {
                pcVar14 = strstr(req->reqbuf,"Authorization: NTLM TlRMTVNTUAAD");
                if (pcVar14 == (char *)0x0) {
                  pcVar14 = strstr(req->reqbuf,"Authorization: NTLM TlRMTVNTUAAB");
                  if (pcVar14 == (char *)0x0) goto LAB_00106d1c;
                  sVar19 = req->partno + 0x3e9;
                  req->partno = sVar19;
                  req->ntlm = true;
                  pcVar14 = "Received NTLM type-1, sending back data %ld";
                }
                else {
                  req->partno = req->partno + 0x3ea;
                  req->ntlm = true;
                  logmsg("Received NTLM type-3, sending back data %ld");
                  sVar19 = req->cl;
                  if (sVar19 == 0) goto LAB_00106e74;
                  pcVar14 = "  Expecting %zu POSTed bytes";
                }
              }
              else {
LAB_00106d1c:
                lVar5 = req->partno;
                if ((lVar5 < 1000) ||
                   (pcVar14 = strstr(req->reqbuf,"Authorization: Basic"), pcVar14 == (char *)0x0))
                goto LAB_00106e74;
                sVar19 = lVar5 + 1;
                req->partno = sVar19;
                pcVar14 = "Received Basic request, sending back data %ld";
              }
              logmsg(pcVar14,sVar19);
            }
            else {
              logmsg("Negotiate: prev_testno: %d, prev_partno: %d",ProcessRequest_prev_testno,
                     ProcessRequest_prev_partno);
              if (req->testno == ProcessRequest_prev_testno) {
                plVar11 = &ProcessRequest_prev_partno;
              }
              else {
                plVar11 = &req->partno;
                ProcessRequest_prev_testno = req->testno;
              }
              ProcessRequest_prev_partno = *plVar11 + 1;
              req->partno = ProcessRequest_prev_partno;
            }
LAB_00106e74:
            pcVar14 = strstr(req->reqbuf,"Connection: close");
            if (pcVar14 != (char *)0x0) {
              req->open = false;
            }
            pcVar14 = end_of_headers;
            iVar3 = req->pipe;
            if (iVar3 == 0) {
              if (((((req->open == true) && (10 < req->prot_version)) &&
                   (sVar19 = req->offset, sVar8 = strlen(end_of_headers),
                   pcVar6 + sVar8 < req->reqbuf + sVar19)) && (req->cl == 0)) &&
                 ((((req->reqbuf[0] == 'G' && (req->reqbuf[1] == 'E')) && (req->reqbuf[2] == 'T'))
                  || (iVar3 = strncmp(req->reqbuf,"HEAD",4), iVar3 == 0)))) {
                req->checkindex = (size_t)(pcVar6 + (sVar8 - (long)req));
                req->pipelining = true;
              }
            }
            else {
              do {
                iVar3 = iVar3 + -1;
                if (got_exit_signal != 0) goto LAB_00106fb3;
                sVar19 = req->checkindex;
                pcVar6 = strstr(req->reqbuf + sVar19,pcVar14);
                if (pcVar6 == (char *)0x0) {
                  pcVar6 = (char *)0x0;
                  break;
                }
                sVar8 = strlen(pcVar14);
                req->checkindex = (size_t)(pcVar6 + sVar8 + (sVar19 - (long)(req->reqbuf + sVar19)))
                ;
                req->pipe = iVar3;
              } while (iVar3 != 0);
            }
            uVar18 = 1;
            if ((req->auth_req != true) || (req->auth != false)) {
              if ((req->upgrade == true) &&
                 (pcVar14 = strstr(req->reqbuf,"Upgrade:"), pcVar14 != (char *)0x0)) {
                logmsg("Found Upgrade: in request and allows it");
                req->upgrade_request = true;
              }
              uVar10 = req->cl;
              if (uVar10 != 0) {
                sVar19 = req->offset;
                sVar8 = strlen(end_of_headers);
                uVar18 = (uint)(uVar10 <= (long)req + (sVar19 - (long)(pcVar6 + sVar8)));
              }
              goto LAB_00106fb9;
            }
            pcVar14 = "Return early due to auth requested by none provided";
            uVar18 = 1;
            goto LAB_00106a32;
          }
          pcVar14 = "request not complete yet";
          uVar18 = 0;
LAB_00106a32:
          logmsg(pcVar14);
        }
LAB_00106fb9:
        req->done_processing = uVar18;
        if (got_exit_signal != 0) {
          return -1;
        }
        if ((uVar18 != 0) && (req->pipe != 0)) {
          logmsg("Waiting for another piped request");
          req->done_processing = 0;
          req->pipe = req->pipe + -1;
        }
        uVar10 = req->offset;
        if (uVar10 == 149999) goto LAB_00107006;
        if (149999 < uVar10) {
          pcVar14 = "Request buffer overflow, closing connection";
          goto LAB_0010700d;
        }
        req->reqbuf[uVar10] = '\0';
        uVar4 = 1;
        uVar18 = 1;
        if (req->done_processing != 0) goto LAB_00107020;
        goto LAB_0010703a;
      }
      puVar7 = (uint *)__errno_location();
      uVar18 = *puVar7;
      if (uVar18 == 0xb) {
        return 0;
      }
      pcVar14 = strerror(uVar18);
      logmsg("recv() returned error: (%d) %s",(ulong)uVar18,pcVar14);
    }
    req->reqbuf[req->offset] = '\0';
    storerequest(req->reqbuf,req->offset);
    uVar4 = 0xffffffff;
  }
  return uVar4;
code_r0x00106afb:
  pcVar13 = strchr(pcVar14,10);
  pcVar14 = pcVar13 + 1;
  if (pcVar13 == (char *)0x0) goto LAB_00106b11;
  goto LAB_00106ab4;
}

Assistant:

static int get_request(curl_socket_t sock, struct httprequest *req)
{
  int fail = 0;
  char *reqbuf = req->reqbuf;
  ssize_t got = 0;
  int overflow = 0;

  char *pipereq = NULL;
  size_t pipereq_length = 0;

  if(req->pipelining) {
    pipereq = reqbuf + req->checkindex;
    pipereq_length = req->offset - req->checkindex;

    /* Now that we've got the pipelining info we can reset the
       pipelining-related vars which were skipped in init_httprequest */
    req->pipelining = FALSE;
    req->checkindex = 0;
    req->offset = 0;
  }

  if(req->offset >= REQBUFSIZ-1) {
    /* buffer is already full; do nothing */
    overflow = 1;
  }
  else {
    if(pipereq_length && pipereq) {
      memmove(reqbuf, pipereq, pipereq_length);
      got = curlx_uztosz(pipereq_length);
      pipereq_length = 0;
    }
    else {
      if(req->skip)
        /* we are instructed to not read the entire thing, so we make sure to
           only read what we're supposed to and NOT read the enire thing the
           client wants to send! */
        got = sread(sock, reqbuf + req->offset, req->cl);
      else
        got = sread(sock, reqbuf + req->offset, REQBUFSIZ-1 - req->offset);
    }
    if(got_exit_signal)
      return -1;
    if(got == 0) {
      logmsg("Connection closed by client");
      fail = 1;
    }
    else if(got < 0) {
      int error = SOCKERRNO;
      if(EAGAIN == error || EWOULDBLOCK == error) {
        /* nothing to read at the moment */
        return 0;
      }
      logmsg("recv() returned error: (%d) %s", error, strerror(error));
      fail = 1;
    }
    if(fail) {
      /* dump the request received so far to the external file */
      reqbuf[req->offset] = '\0';
      storerequest(reqbuf, req->offset);
      return -1;
    }

    logmsg("Read %zd bytes", got);

    req->offset += (size_t)got;
    reqbuf[req->offset] = '\0';

    req->done_processing = ProcessRequest(req);
    if(got_exit_signal)
      return -1;
    if(req->done_processing && req->pipe) {
      logmsg("Waiting for another piped request");
      req->done_processing = 0;
      req->pipe--;
    }
  }

  if(overflow || (req->offset == REQBUFSIZ-1 && got > 0)) {
    logmsg("Request would overflow buffer, closing connection");
    /* dump request received so far to external file anyway */
    reqbuf[REQBUFSIZ-1] = '\0';
    fail = 1;
  }
  else if(req->offset > REQBUFSIZ-1) {
    logmsg("Request buffer overflow, closing connection");
    /* dump request received so far to external file anyway */
    reqbuf[REQBUFSIZ-1] = '\0';
    fail = 1;
  }
  else
    reqbuf[req->offset] = '\0';

  /* at the end of a request dump it to an external file */
  if(fail || req->done_processing)
    storerequest(reqbuf, req->pipelining ? req->checkindex : req->offset);
  if(got_exit_signal)
    return -1;

  return fail ? -1 : 1;
}